

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O2

void duckdb::FixedSizeFetchRow<duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnFetchState *state,row_t row_id,Vector *result,
               idx_t result_idx)

{
  idx_t iVar1;
  data_ptr_t pdVar2;
  undefined8 uVar3;
  BufferManager *pBVar4;
  data_ptr_t pdVar5;
  unsigned_long uVar6;
  BufferHandle handle;
  BufferHandle local_40;
  
  pBVar4 = BufferManager::GetBufferManager(segment->db);
  (*pBVar4->_vptr_BufferManager[7])(&local_40,pBVar4,&segment->block);
  pdVar5 = BufferHandle::Ptr(&local_40);
  iVar1 = segment->offset;
  uVar6 = NumericCastImpl<unsigned_long,_long,_false>::Convert(row_id);
  pdVar2 = result->data;
  uVar3 = *(undefined8 *)(pdVar5 + uVar6 * 0x10 + iVar1 + 8);
  *(undefined8 *)(pdVar2 + result_idx * 0x10) = *(undefined8 *)(pdVar5 + uVar6 * 0x10 + iVar1);
  *(undefined8 *)(pdVar2 + result_idx * 0x10 + 8) = uVar3;
  BufferHandle::~BufferHandle(&local_40);
  return;
}

Assistant:

void FixedSizeFetchRow(ColumnSegment &segment, ColumnFetchState &state, row_t row_id, Vector &result,
                       idx_t result_idx) {
	auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
	auto handle = buffer_manager.Pin(segment.block);

	// first fetch the data from the base table
	auto data_ptr = handle.Ptr() + segment.GetBlockOffset() + NumericCast<idx_t>(row_id) * sizeof(T);

	memcpy(FlatVector::GetData(result) + result_idx * sizeof(T), data_ptr, sizeof(T));
}